

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O1

void __thiscall
SimpleLogger::put(SimpleLogger *this,int level,char *source_file,char *func_name,size_t line_number,
                 char *format,...)

{
  char cVar1;
  pointer pLVar2;
  pointer pLVar3;
  size_t sVar4;
  uint uVar5;
  char in_AL;
  uint uVar6;
  int iVar7;
  Status SVar8;
  long lVar9;
  time_point now;
  size_t start_pos;
  long lVar10;
  long lVar11;
  long lVar12;
  char *__format;
  ulong uVar13;
  size_t sVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  long *in_FS_OFFSET;
  bool bVar18;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  unique_lock<std::mutex> l;
  va_list args;
  TimeInfo lt;
  undefined1 local_10e8 [48];
  undefined8 local_10b8;
  undefined8 local_10a8;
  undefined8 local_1098;
  undefined8 local_1088;
  undefined8 local_1078;
  undefined8 local_1068;
  undefined8 local_1058;
  undefined8 local_1048;
  char msg [4096];
  
  if (in_AL != '\0') {
    local_10b8 = in_XMM0_Qa;
    local_10a8 = in_XMM1_Qa;
    local_1098 = in_XMM2_Qa;
    local_1088 = in_XMM3_Qa;
    local_1078 = in_XMM4_Qa;
    local_1068 = in_XMM5_Qa;
    local_1058 = in_XMM6_Qa;
    local_1048 = in_XMM7_Qa;
  }
  if ((this->curLogLevel).super___atomic_base<int>._M_i < level) {
    return;
  }
  if (((&this->field_0x58)[*(long *)(*(long *)&this->fs + -0x18)] & 5) != 0) {
    return;
  }
  lVar10 = *in_FS_OFFSET;
  if (*(char *)(lVar10 + -0x18) == '\0') {
    put();
  }
  uVar16 = (ulong)(uint)tid_digits.super___atomic_base<int>._M_i;
  if (*(char *)(lVar10 + -0x10) == '\0') {
    put();
  }
  if (source_file == (char *)0x0) {
    lVar12 = 0;
  }
  else {
    lVar9 = 0;
    lVar11 = 0;
    do {
      cVar1 = source_file[lVar9];
      lVar12 = lVar9;
      if (((cVar1 != '/') && (cVar1 != '\\')) && (lVar12 = lVar11, cVar1 == '\0')) break;
      lVar9 = lVar9 + 1;
      lVar11 = lVar12;
    } while (source_file != (char *)0x0);
  }
  now.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  SimpleLoggerMgr::TimeInfo::TimeInfo(&lt,now);
  uVar6 = this->tzGap;
  uVar5 = -uVar6;
  if (0 < (int)uVar6) {
    uVar5 = uVar6;
  }
  uVar6 = snprintf(msg,0x1000,"%04d-%02d-%02dT%02d:%02d:%02d.%03d_%03d%c%02d:%02d [%*u] [%s] ",
                   (ulong)(uint)lt.year,(ulong)(uint)lt.month,(ulong)(uint)lt.day,
                   (ulong)(uint)lt.hour,(ulong)(uint)lt.min,(ulong)(uint)lt.sec,(ulong)(uint)lt.msec
                   ,(ulong)(uint)lt.usec,(ulong)(((int)uVar6 >> 0x1f) * -2 + 0x2b),
                   (ulong)uVar5 / 0x3c,(ulong)(uVar5 % 0x3c),uVar16,(ulong)*(uint *)(lVar10 + -0x14)
                   ,_ZZN12SimpleLogger3putEiPKcS1_mS1_zE8lv_names_rel +
                    *(int *)(_ZZN12SimpleLogger3putEiPKcS1_mS1_zE8lv_names_rel + (long)level * 4));
  uVar13 = 0x1000;
  if (uVar6 < 0x1000) {
    uVar13 = (ulong)uVar6;
  }
  uVar17 = 0x1000 - uVar13;
  if (0xfff < uVar6) {
    uVar17 = 0;
  }
  args[0].gp_offset = 0x30;
  args[0].fp_offset = 0x30;
  args[0].overflow_arg_area = &stack0x00000008;
  args[0].reg_save_area = local_10e8;
  iVar7 = vsnprintf(msg + uVar13,uVar17,format,args);
  uVar15 = (long)iVar7;
  if (uVar17 < (ulong)(long)iVar7) {
    uVar15 = uVar17;
  }
  uVar15 = uVar15 + uVar13;
  uVar13 = uVar17 - uVar15;
  if (uVar17 < uVar15) {
    uVar13 = 0;
  }
  if (func_name == (char *)0x0 || source_file == (char *)0x0) {
    iVar7 = snprintf(msg + uVar15,uVar13,"\n");
  }
  else {
    lVar11 = lVar12 + 1;
    if (lVar12 == 0) {
      lVar11 = 0;
    }
    iVar7 = snprintf(msg + uVar15,uVar13,"\t[%s:%zu, %s()]\n",source_file + lVar11,line_number);
  }
  uVar17 = (long)iVar7;
  if (uVar13 < (ulong)(long)iVar7) {
    uVar17 = uVar13;
  }
  pLVar2 = (this->logs).
           super__Vector_base<SimpleLogger::LogElem,_std::allocator<SimpleLogger::LogElem>_>._M_impl
           .super__Vector_impl_data._M_start;
  pLVar3 = (this->logs).
           super__Vector_base<SimpleLogger::LogElem,_std::allocator<SimpleLogger::LogElem>_>._M_impl
           .super__Vector_impl_data._M_finish;
  do {
    sVar4 = (this->cursor).super___atomic_base<unsigned_long>._M_i;
    LOCK();
    start_pos = (this->cursor).super___atomic_base<unsigned_long>._M_i;
    bVar18 = sVar4 == start_pos;
    if (bVar18) {
      (this->cursor).super___atomic_base<unsigned_long>._M_i =
           (sVar4 + 1) % (ulong)(((long)pLVar3 - (long)pLVar2 >> 4) * -0xff00ff00ff00ff);
      start_pos = sVar4;
    }
    UNLOCK();
  } while (!bVar18);
  pLVar3 = pLVar2 + sVar4;
  SVar8 = pLVar2[sVar4].status._M_i;
  while ((SVar8 & ~DIRTY) != CLEAN) {
    sched_yield();
    SVar8 = (pLVar3->status)._M_i;
  }
  if (((pLVar3->status)._M_i == DIRTY) && (bVar18 = flush(this,start_pos), !bVar18)) {
    while ((pLVar3->status)._M_i == DIRTY) {
      sched_yield();
    }
  }
  LOCK();
  bVar18 = (pLVar3->status)._M_i == CLEAN;
  if (bVar18) {
    (pLVar3->status)._M_i = WRITING;
  }
  UNLOCK();
  if (bVar18) {
    sVar14 = uVar17 + uVar15;
    if (0xfff < sVar14) {
      sVar14 = 0x1000;
    }
    pLVar3->len = sVar14;
    memcpy(pLVar3->ctx,msg,sVar14);
    LOCK();
    (pLVar3->status)._M_i = DIRTY;
    UNLOCK();
  }
  if ((this->curDispLevel).super___atomic_base<int>._M_i < level) {
    return;
  }
  uVar6 = snprintf(msg,0x1000,
                   " [\x1b[33m%02d\x1b[0m:\x1b[33m%02d\x1b[0m:\x1b[33m%02d\x1b[0m.\x1b[33m%03d\x1b[0m \x1b[33m%03d\x1b[0m] [tid \x1b[1;34m%*u\x1b[0m] [%s] "
                   ,(ulong)(uint)lt.hour,(ulong)(uint)lt.min,(ulong)(uint)lt.sec,
                   (ulong)(uint)lt.msec,(ulong)(uint)lt.usec,uVar16,(ulong)*(uint *)(lVar10 + -0x14)
                   ,_ZZN12SimpleLogger3putEiPKcS1_mS1_zE16colored_lv_names_rel +
                    *(int *)(_ZZN12SimpleLogger3putEiPKcS1_mS1_zE16colored_lv_names_rel +
                            (long)level * 4));
  uVar16 = 0x1000;
  if (uVar6 < 0x1000) {
    uVar16 = (ulong)uVar6;
  }
  uVar13 = 0;
  if (uVar6 < 0x1000) {
    uVar13 = 0x1000 - uVar16;
  }
  if (func_name == (char *)0x0 || source_file == (char *)0x0) {
    iVar7 = snprintf(msg + uVar16,uVar13,"\n");
  }
  else {
    lVar10 = lVar12 + 1;
    if (lVar12 == 0) {
      lVar10 = 0;
    }
    iVar7 = snprintf(msg + uVar16,uVar13,
                     "[\x1b[32m%s\x1b[0m:\x1b[1;31m%zu\x1b[0m, \x1b[36m%s()\x1b[0m]\n",
                     source_file + lVar10,line_number,func_name);
  }
  uVar17 = (long)iVar7;
  if (uVar13 < (ulong)(long)iVar7) {
    uVar17 = uVar13;
  }
  uVar17 = uVar17 + uVar16;
  args[0].reg_save_area = local_10e8;
  args[0].overflow_arg_area = &stack0x00000008;
  args[0].gp_offset = 0x30;
  args[0].fp_offset = 0x30;
  if (level == 0) {
    __format = "\x1b[1;33m";
  }
  else {
    if (level != 1) goto LAB_00184257;
    __format = "\x1b[1;31m";
  }
  bVar18 = uVar13 < uVar17;
  uVar13 = uVar13 - uVar17;
  if (bVar18) {
    uVar13 = 0;
  }
  iVar7 = snprintf(msg + uVar17,uVar13,__format);
  uVar16 = (long)iVar7;
  if (uVar13 < (ulong)(long)iVar7) {
    uVar16 = uVar13;
  }
  uVar17 = uVar17 + uVar16;
LAB_00184257:
  uVar16 = uVar13 - uVar17;
  if (uVar13 < uVar17) {
    uVar16 = 0;
  }
  iVar7 = vsnprintf(msg + uVar17,uVar16,format,args);
  uVar13 = (long)iVar7;
  if (uVar16 < (ulong)(long)iVar7) {
    uVar13 = uVar16;
  }
  uVar13 = uVar13 + uVar17;
  sVar14 = uVar16 - uVar13;
  if (uVar16 < uVar13) {
    sVar14 = 0;
  }
  snprintf(msg + uVar13,sVar14,"\x1b[0m");
  l._M_device = &SimpleLoggerMgr::displayLock;
  l._M_owns = false;
  std::unique_lock<std::mutex>::lock(&l);
  l._M_owns = true;
  sVar14 = strlen(msg);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,msg,sVar14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  std::unique_lock<std::mutex>::unlock(&l);
  std::unique_lock<std::mutex>::~unique_lock(&l);
  return;
}

Assistant:

void SimpleLogger::put(int level,
                       const char* source_file,
                       const char* func_name,
                       size_t line_number,
                       const char* format,
                       ...)
{
    if (level > curLogLevel.load(MOR)) return;
    if (!fs) return;

    static const char* lv_names[7] = {"====",
                                      "FATL", "ERRO", "WARN",
                                      "INFO", "DEBG", "TRAC"};
    char msg[MSG_SIZE];
    thread_local ThreadWrapper thread_wrapper;
#ifdef __linux__
    const int TID_DIGITS = tid_digits;
    thread_local uint32_t tid_hash = thread_wrapper.myTid;
#else
    thread_local std::thread::id tid = std::this_thread::get_id();
    thread_local uint32_t tid_hash = std::hash<std::thread::id>{}(tid) % 0x10000;
#endif

    // Print filename part only (excluding directory path).
    size_t last_slash = 0;
    for (size_t ii=0; source_file && source_file[ii] != 0; ++ii) {
        if (source_file[ii] == '/' || source_file[ii] == '\\') last_slash = ii;
    }

    SimpleLoggerMgr::TimeInfo lt( std::chrono::system_clock::now() );
    int tz_gap_abs = (tzGap < 0) ? (tzGap * -1) : (tzGap);

    // [time] [tid] [log type] [user msg] [stack info]
    // Timestamp: ISO 8601 format.
    size_t cur_len = 0;
    size_t avail_len = MSG_SIZE;
    size_t msg_len = 0;

#ifdef __linux__
    _snprintf( msg, avail_len, cur_len, msg_len,
               "%04d-%02d-%02dT%02d:%02d:%02d.%03d_%03d%c%02d:%02d "
               "[%*u] "
               "[%s] ",
               lt.year, lt.month, lt.day,
               lt.hour, lt.min, lt.sec, lt.msec, lt.usec,
               (tzGap >= 0)?'+':'-', tz_gap_abs / 60, tz_gap_abs % 60,
               TID_DIGITS, tid_hash,
               lv_names[level] );
#else
    _snprintf( msg, avail_len, cur_len, msg_len,
               "%04d-%02d-%02dT%02d:%02d:%02d.%03d_%03d%c%02d:%02d "
               "[%04x] "
               "[%s] ",
               lt.year, lt.month, lt.day,
               lt.hour, lt.min, lt.sec, lt.msec, lt.usec,
               (tzGap >= 0)?'+':'-', tz_gap_abs / 60, tz_gap_abs % 60,
               tid_hash,
               lv_names[level] );
#endif

    va_list args;
    va_start(args, format);
    _vsnprintf(msg, avail_len, cur_len, msg_len, format, args);
    va_end(args);

    if (source_file && func_name) {
        _snprintf( msg, avail_len, cur_len, msg_len,
                   "\t[%s:%zu, %s()]\n",
                   source_file + ((last_slash)?(last_slash+1):0),
                   line_number, func_name );
    } else {
        _snprintf(msg, avail_len, cur_len, msg_len, "\n");
    }

    size_t num = logs.size();
    uint64_t cursor_exp = 0, cursor_val = 0;
    LogElem* ll = nullptr;
    do {
        cursor_exp = cursor.load(MOR);
        cursor_val = (cursor_exp + 1) % num;
        ll = &logs[cursor_exp];
    } while ( !cursor.compare_exchange_strong(cursor_exp, cursor_val, MOR) );
    while ( !ll->available() ) std::this_thread::yield();

    if (ll->needToFlush()) {
        // Allow only one thread to flush.
        if (!flush(cursor_exp)) {
            // Other threads: wait.
            while (ll->needToFlush()) std::this_thread::yield();
        }
    }
    ll->write(cur_len, msg);

    if (level > curDispLevel) return;

    // Console part.
    static const char* colored_lv_names[7] =
                       { _CL_B_BROWN("===="),
                         _CL_WHITE_FG_RED_BG("FATL"),
                         _CL_B_RED("ERRO"),
                         _CL_B_MAGENTA("WARN"),
                         "INFO",
                         _CL_D_GRAY("DEBG"),
                         _CL_D_GRAY("TRAC") };

    cur_len = 0;
    avail_len = MSG_SIZE;
#ifdef __linux__
    _snprintf( msg, avail_len, cur_len, msg_len,
               " [" _CL_BROWN("%02d") ":" _CL_BROWN("%02d") ":" _CL_BROWN("%02d") "."
               _CL_BROWN("%03d") " " _CL_BROWN("%03d")
               "] [tid " _CL_B_BLUE("%*u") "] "
               "[%s] ",
               lt.hour, lt.min, lt.sec, lt.msec, lt.usec,
               TID_DIGITS, tid_hash,
               colored_lv_names[level] );
#else
    _snprintf( msg, avail_len, cur_len, msg_len,
               " [" _CL_BROWN("%02d") ":" _CL_BROWN("%02d") ":" _CL_BROWN("%02d") "."
               _CL_BROWN("%03d") " " _CL_BROWN("%03d")
               "] [tid " _CL_B_BLUE("%04x") "] "
               "[%s] ",
               lt.hour, lt.min, lt.sec, lt.msec, lt.usec,
               tid_hash,
               colored_lv_names[level] );
#endif

    if (source_file && func_name) {
        _snprintf( msg, avail_len, cur_len, msg_len,
                   "[" _CL_GREEN("%s") ":" _CL_B_RED("%zu")
                   ", " _CL_CYAN("%s()") "]\n",
                   source_file + ((last_slash)?(last_slash+1):0),
                   line_number, func_name );
    } else {
        _snprintf(msg, avail_len, cur_len, msg_len, "\n");
    }

    va_start(args, format);

#ifndef LOGGER_NO_COLOR
    if (level == 0) {
        _snprintf(msg, avail_len, cur_len, msg_len, _CLM_B_BROWN);
    } else if (level == 1) {
        _snprintf(msg, avail_len, cur_len, msg_len, _CLM_B_RED);
    }
#endif

    _vsnprintf(msg, avail_len, cur_len, msg_len, format, args);

#ifndef LOGGER_NO_COLOR
    _snprintf(msg, avail_len, cur_len, msg_len, _CLM_END);
#endif

    va_end(args);
    (void)cur_len;

    std::unique_lock<std::mutex> l(SimpleLoggerMgr::displayLock);
    std::cout << msg << std::endl;
    l.unlock();
}